

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void EncloseBlockText(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Bool BVar2;
  Node *pNVar3;
  bool bVar4;
  Node *tempNext;
  Node *p;
  Node *block;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar3 = node;
  while (next = pNVar3, next != (Node *)0x0) {
    pNVar3 = next->next;
    if (next->content != (Node *)0x0) {
      EncloseBlockText(doc,next->content);
    }
    if ((((((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) && (next->tag->id == TidyTag_FORM))
         || (((next != (Node *)0x0 && (next->tag != (Dict *)0x0)) &&
             (next->tag->id == TidyTag_NOSCRIPT)))) ||
        (((next != (Node *)0x0 && (next->tag != (Dict *)0x0)) &&
         (next->tag->id == TidyTag_BLOCKQUOTE)))) && (next->content != (Node *)0x0)) {
      p = next->content;
      BVar2 = prvTidynodeIsText(p);
      if (((BVar2 != no) && (BVar2 = prvTidyIsBlank(doc->lexer,p), BVar2 == no)) ||
         ((BVar2 = prvTidynodeIsElement(p), BVar2 != no &&
          (BVar2 = nodeCMIsOnlyInline(p), BVar2 != no)))) {
        pNVar3 = prvTidyInferredTag(doc,TidyTag_P);
        prvTidyInsertNodeBeforeElement(p,pNVar3);
        while( true ) {
          bVar4 = false;
          if (p != (Node *)0x0) {
            BVar2 = prvTidynodeIsElement(p);
            bVar4 = true;
            if (BVar2 != no) {
              BVar2 = nodeCMIsOnlyInline(p);
              bVar4 = BVar2 != no;
            }
          }
          if (!bVar4) break;
          pNVar1 = p->next;
          prvTidyRemoveNode(p);
          prvTidyInsertNodeAtEnd(pNVar3,p);
          p = pNVar1;
        }
        TrimSpaces(doc,pNVar3);
        pNVar3 = next;
      }
    }
  }
  return;
}

Assistant:

static void EncloseBlockText(TidyDocImpl* doc, Node* node)
{
    Node *next;
    Node *block;

    while (node)
    {
        next = node->next;

        if (node->content)
            EncloseBlockText(doc, node->content);

        if (!(nodeIsFORM(node) || nodeIsNOSCRIPT(node) ||
              nodeIsBLOCKQUOTE(node))
            || !node->content)
        {
            node = next;
            continue;
        }

        block = node->content;

        if ((TY_(nodeIsText)(block) && !TY_(IsBlank)(doc->lexer, block)) ||
            (TY_(nodeIsElement)(block) && nodeCMIsOnlyInline(block)))
        {
            Node* p = TY_(InferredTag)(doc, TidyTag_P);
            TY_(InsertNodeBeforeElement)(block, p);
            while (block &&
                   (!TY_(nodeIsElement)(block) || nodeCMIsOnlyInline(block)))
            {
                Node* tempNext = block->next;
                TY_(RemoveNode)(block);
                TY_(InsertNodeAtEnd)(p, block);
                block = tempNext;
            }
            TrimSpaces(doc, p);
            continue;
        }

        node = next;
    }
}